

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptPostfixExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  EHlslTokenClass op;
  TOperator op_00;
  int iVar2;
  TIntermTyped *pTVar3;
  undefined4 extraout_var;
  TPoolAllocator *this_00;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 this_01;
  char *pcVar4;
  HlslParseContext *pHVar5;
  _func_int **pp_Var6;
  HlslToken field;
  HlslToken idToken;
  TSourceLoc loc;
  HlslToken local_a8;
  HlslToken local_78;
  TSourceLoc local_48;
  
  local_78.field_2.string =
       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
  local_78.loc.name = (TString *)0x0;
  local_78.loc.string = 0;
  local_78.loc.line = 0;
  local_78.loc.column = 0;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar1) {
    bVar1 = acceptExpression(this,node);
    if (!bVar1) {
      pHVar5 = this->parseContext;
      pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar4 = "expression";
      goto LAB_003a5169;
    }
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (!bVar1) {
      pHVar5 = this->parseContext;
      pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar4 = ")";
      goto LAB_003a5169;
    }
  }
  else {
    bVar1 = acceptLiteral(this,node);
    if ((!bVar1) && (bVar1 = acceptConstructor(this,node), !bVar1)) {
      bVar1 = acceptIdentifier(this,&local_78);
      this_01 = local_78.field_2;
      if (!bVar1) {
        return false;
      }
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon);
      if (bVar1) {
        do {
          pcVar4 = ((this_01.string)->_M_dataplus)._M_p;
          this_00 = GetThreadPoolAllocator();
          this_01.string = (TString *)TPoolAllocator::allocate(this_00,0x28);
          local_a8.loc.name = (TString *)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     this_01.string,pcVar4,(pool_allocator<char> *)&local_a8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_01.string,(this->parseContext->super_TParseContextBase).scopeMangler);
          bVar1 = acceptIdentifier(this,&local_78);
          if (!bVar1) {
            pHVar5 = this->parseContext;
            pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar4 = "identifier after ::";
            goto LAB_003a5169;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          _M_append(this_01.string,((local_78.field_2.string)->_M_dataplus)._M_p,
                    (local_78.field_2.string)->_M_string_length);
          bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColonColon);
        } while (bVar1);
      }
      bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
      if (bVar1) {
        bVar1 = acceptFunctionCall(this,&local_78.loc,this_01.string,node,(TIntermTyped *)0x0);
        if (!bVar1) {
          pHVar5 = this->parseContext;
          pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar4 = "function call arguments";
          goto LAB_003a5169;
        }
      }
      else {
        pTVar3 = HlslParseContext::handleVariable(this->parseContext,&local_78.loc,this_01.string);
        *node = pTVar3;
        if (pTVar3 == (TIntermTyped *)0x0) {
          return false;
        }
      }
    }
  }
LAB_003a4e43:
  do {
    while( true ) {
      local_48.column = (this->super_HlslTokenStream).token.loc.column;
      local_48._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      local_48.name = (this->super_HlslTokenStream).token.loc.name;
      local_48.string = (this->super_HlslTokenStream).token.loc.string;
      local_48.line = (this->super_HlslTokenStream).token.loc.line;
      op = HlslTokenStream::peek(&this->super_HlslTokenStream);
      op_00 = HlslOpMap::postUnary(op);
      if (EOpScoping < op_00) {
        return true;
      }
      if ((0x130000000003000U >> ((ulong)op_00 & 0x3f) & 1) == 0) {
        return true;
      }
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
      if (0x34 < (int)op_00) break;
      if (op_00 - EOpPostIncrement < 2) {
        pTVar3 = TIntermediate::addUnaryMath(this->intermediate,op_00,*node,&local_48);
        *node = pTVar3;
        pTVar3 = HlslParseContext::handleLvalue(this->parseContext,&local_48,"unary operator",node);
        *node = pTVar3;
      }
      else {
        if (op_00 != EOpIndexIndirect) {
LAB_003a51c8:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                        ,0xdb2,"bool glslang::HlslGrammar::acceptPostfixExpression(TIntermTyped *&)"
                       );
        }
        local_a8.loc.name = (TString *)0x0;
        bVar1 = acceptExpression(this,(TIntermTyped **)&local_a8);
        if ((!bVar1) ||
           (bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBracket),
           !bVar1)) {
          pHVar5 = this->parseContext;
          pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar4 = "expression followed by \']\'";
          goto LAB_003a5169;
        }
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
        pHVar5 = this->parseContext;
        iVar2 = (**((TIntermNode *)&(local_a8.loc.name)->_M_dataplus)->_vptr_TIntermNode)();
        pTVar3 = HlslParseContext::handleBracketDereference
                           (pHVar5,(TSourceLoc *)CONCAT44(extraout_var,iVar2),*node,
                            (TIntermTyped *)local_a8.loc.name);
        *node = pTVar3;
        if (pTVar3 == (TIntermTyped *)0x0) {
          return false;
        }
      }
    }
    if ((op_00 != EOpScoping) && (op_00 != EOpIndexDirectStruct)) goto LAB_003a51c8;
    local_a8.field_2.string = (TString *)0x0;
    local_a8.loc.name = (TString *)0x0;
    local_a8.loc.string = 0;
    local_a8.loc.line = 0;
    local_a8.loc.column = 0;
    bVar1 = acceptIdentifier(this,&local_a8);
    if (!bVar1) {
      pcVar4 = "swizzle or member";
      goto LAB_003a514c;
    }
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (!bVar1) {
      pTVar3 = HlslParseContext::handleDotDereference
                         (this->parseContext,&local_a8.loc,*node,local_a8.field_2.string);
      *node = pTVar3;
      goto LAB_003a4e43;
    }
    bVar1 = acceptFunctionCall(this,&local_a8.loc,local_a8.field_2.string,node,*node);
  } while (bVar1);
  pcVar4 = "function parameters";
LAB_003a514c:
  pHVar5 = this->parseContext;
  pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
LAB_003a5169:
  (*pp_Var6[0x2d])(pHVar5,&(this->super_HlslTokenStream).token,"Expected",pcVar4,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptPostfixExpression(TIntermTyped*& node)
{
    // Not implemented as self-recursive:
    // The logical "right recursion" is done with a loop at the end

    // idToken will pick up either a variable or a function name in a function call
    HlslToken idToken;

    // Find something before the postfix operations, as they can't operate
    // on nothing.  So, no "return true", they fall through, only "return false".
    if (acceptTokenClass(EHTokLeftParen)) {
        // LEFT_PAREN expression RIGHT_PAREN
        if (! acceptExpression(node)) {
            expected("expression");
            return false;
        }
        if (! acceptTokenClass(EHTokRightParen)) {
            expected(")");
            return false;
        }
    } else if (acceptLiteral(node)) {
        // literal (nothing else to do yet)
    } else if (acceptConstructor(node)) {
        // constructor (nothing else to do yet)
    } else if (acceptIdentifier(idToken)) {
        // user-type, namespace name, variable, or function name
        TString* fullName = idToken.string;
        while (acceptTokenClass(EHTokColonColon)) {
            // user-type or namespace name
            fullName = NewPoolTString(fullName->c_str());
            fullName->append(parseContext.scopeMangler);
            if (acceptIdentifier(idToken))
                fullName->append(*idToken.string);
            else {
                expected("identifier after ::");
                return false;
            }
        }
        if (! peekTokenClass(EHTokLeftParen)) {
            node = parseContext.handleVariable(idToken.loc, fullName);
            if (node == nullptr)
                return false;
        } else if (acceptFunctionCall(idToken.loc, *fullName, node, nullptr)) {
            // function_call (nothing else to do yet)
        } else {
            expected("function call arguments");
            return false;
        }
    } else {
        // nothing found, can't post operate
        return false;
    }

    // Something was found, chain as many postfix operations as exist.
    do {
        TSourceLoc loc = token.loc;
        TOperator postOp = HlslOpMap::postUnary(peek());

        // Consume only a valid post-unary operator, otherwise we are done.
        switch (postOp) {
        case EOpIndexDirectStruct:
        case EOpIndexIndirect:
        case EOpPostIncrement:
        case EOpPostDecrement:
        case EOpScoping:
            advanceToken();
            break;
        default:
            return true;
        }

        // We have a valid post-unary operator, process it.
        switch (postOp) {
        case EOpScoping:
        case EOpIndexDirectStruct:
        {
            // DOT IDENTIFIER
            // includes swizzles, member variables, and member functions
            HlslToken field;
            if (! acceptIdentifier(field)) {
                expected("swizzle or member");
                return false;
            }

            if (peekTokenClass(EHTokLeftParen)) {
                // member function
                TIntermTyped* thisNode = node;

                // arguments
                if (! acceptFunctionCall(field.loc, *field.string, node, thisNode)) {
                    expected("function parameters");
                    return false;
                }
            } else
                node = parseContext.handleDotDereference(field.loc, node, *field.string);

            break;
        }
        case EOpIndexIndirect:
        {
            // LEFT_BRACKET integer_expression RIGHT_BRACKET
            TIntermTyped* indexNode = nullptr;
            if (! acceptExpression(indexNode) ||
                ! peekTokenClass(EHTokRightBracket)) {
                expected("expression followed by ']'");
                return false;
            }
            advanceToken();
            node = parseContext.handleBracketDereference(indexNode->getLoc(), node, indexNode);
            if (node == nullptr)
                return false;
            break;
        }
        case EOpPostIncrement:
            // INC_OP
            // fall through
        case EOpPostDecrement:
            // DEC_OP
            node = intermediate.addUnaryMath(postOp, node, loc);
            node = parseContext.handleLvalue(loc, "unary operator", node);
            break;
        default:
            assert(0);
            break;
        }
    } while (true);
}